

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O0

bool zmq_send(socket_t *socket,string *s)

{
  size_t size_;
  void *__dest;
  void *__src;
  size_t __n;
  ssize_t sVar1;
  size_t in_RCX;
  int in_R8D;
  undefined1 local_58 [8];
  message_t msg;
  string *s_local;
  socket_t *socket_local;
  
  msg.msg._._56_8_ = s;
  size_ = std::__cxx11::string::size();
  zmq::message_t::message_t((message_t *)local_58,size_);
  __dest = zmq::message_t::data((message_t *)local_58);
  __src = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::size();
  memcpy(__dest,__src,__n);
  sVar1 = zmq::detail::socket_base::send
                    (&socket->super_socket_base,(int)(message_t *)local_58,(void *)0x0,in_RCX,in_R8D
                    );
  zmq::message_t::~message_t((message_t *)local_58);
  return (bool)((byte)sVar1 & 1);
}

Assistant:

bool zmq_send(zmq::socket_t &socket, const std::string &s) {
    zmq::message_t msg(s.size());
    memcpy(msg.data(), s.data(), s.size());

    return socket.send(msg);
}